

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEngine::updateBrush(QRasterPaintEngine *this,QBrush *brush)

{
  long lVar1;
  TransformationType TVar2;
  QRasterPaintEnginePrivate *spanData;
  QRasterPaintEngineState *b;
  QClipData *pQVar3;
  QRasterPaintEnginePrivate *in_RSI;
  long in_FS_OFFSET;
  QRasterPaintEngineState *s;
  QRasterPaintEnginePrivate *d;
  QRasterPaintEnginePrivate *in_stack_ffffffffffffff10;
  QRasterPaintEnginePrivate *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffffa7;
  CompositionMode in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QBrush *in_stack_ffffffffffffffb0;
  QSpanData *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  spanData = d_func((QRasterPaintEngine *)0x562605);
  b = state((QRasterPaintEngine *)0x562614);
  pQVar3 = QRasterPaintEnginePrivate::clip(in_stack_ffffffffffffff18);
  (b->brushData).clip = pQVar3;
  QSpanData::setup(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                   in_stack_ffffffffffffffa8,(bool)in_stack_ffffffffffffffa7);
  uVar4 = true;
  if ((b->fillFlags & 0x40) == 0) {
    QBrush::transform((QBrush *)in_stack_ffffffffffffff10);
    TVar2 = QTransform::type((QTransform *)in_stack_ffffffffffffff18);
    uVar4 = -1 < (int)TVar2;
  }
  if ((bool)uVar4 != false) {
    in_stack_ffffffffffffff10 = d_func((QRasterPaintEngine *)0x5626d9);
    in_stack_ffffffffffffff18 = (QRasterPaintEnginePrivate *)&b->brushData;
    QRasterPaintEnginePrivate::brushMatrix
              ((QRasterPaintEnginePrivate *)CONCAT17(uVar4,in_stack_ffffffffffffff30));
    QRasterPaintEnginePrivate::updateMatrixData
              (in_RSI,(QSpanData *)spanData,(QBrush *)b,
               (QTransform *)CONCAT17(uVar4,in_stack_ffffffffffffff30));
  }
  QBrush::operator=((QBrush *)in_stack_ffffffffffffff18,(QBrush *)in_stack_ffffffffffffff10);
  b->fillFlags = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRasterPaintEngine::updateBrush(const QBrush &brush)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::updateBrush()" << brush;
#endif
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();
    // must set clip prior to setup, as setup uses it...
    s->brushData.clip = d->clip();
    s->brushData.setup(brush, s->intOpacity, s->composition_mode, s->flags.cosmetic_brush);
    if (s->fillFlags & DirtyTransform
        || brush.transform().type() >= QTransform::TxNone)
        d_func()->updateMatrixData(&s->brushData, brush, d->brushMatrix());
    s->lastBrush = brush;
    s->fillFlags = 0;
}